

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

void __thiscall
QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
          (QHttpNetworkRequestPrivate *this,Operation op,Priority pri,QUrl *newUrl)

{
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (&this->super_QHttpNetworkHeaderPrivate,newUrl);
  this->operation = op;
  (this->customVerb).d.d = (Data *)0x0;
  (this->customVerb).d.ptr = (char *)0x0;
  (this->customVerb).d.size = 0;
  (this->fullLocalServerName).d.d = (Data *)0x0;
  (this->fullLocalServerName).d.ptr = (char16_t *)0x0;
  (this->fullLocalServerName).d.size = 0;
  this->priority = pri;
  this->uploadByteDevice = (QNonContiguousByteDevice *)0x0;
  this->autoDecompress = false;
  this->pipeliningAllowed = false;
  this->http2Allowed = true;
  this->http2Direct = false;
  this->h2cAllowed = false;
  this->withCredentials = true;
  this->ssl = false;
  this->preConnect = false;
  this->needResendWithCredentials = false;
  this->redirectCount = 0;
  this->redirectPolicy = ManualRedirectPolicy;
  (this->peerVerifyName).d.d = (Data *)0x0;
  (this->peerVerifyName).d.ptr = (char16_t *)0x0;
  (this->peerVerifyName).d.size = 0;
  return;
}

Assistant:

QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(QHttpNetworkRequest::Operation op,
        QHttpNetworkRequest::Priority pri, const QUrl &newUrl)
    : QHttpNetworkHeaderPrivate(newUrl), operation(op), priority(pri), uploadByteDevice(nullptr),
      autoDecompress(false), pipeliningAllowed(false), http2Allowed(true),
      http2Direct(false), withCredentials(true), preConnect(false), redirectCount(0),
      redirectPolicy(QNetworkRequest::ManualRedirectPolicy)
{
}